

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptConversion.cpp
# Opt level: O3

double Js::JavascriptConversion::ToNumber_Full(Var aValue,ScriptContext *scriptContext)

{
  Type TVar1;
  void *pvVar2;
  code *pcVar3;
  bool bVar4;
  bool bVar5;
  BOOL BVar6;
  undefined4 *puVar7;
  RecyclableObject *pRVar8;
  JavascriptBoolean *pJVar9;
  JavascriptString *this;
  JavascriptTypedNumber<long> *pJVar10;
  JavascriptTypedNumber<unsigned_long> *pJVar11;
  double dVar12;
  undefined1 auVar13 [16];
  ScriptContext *local_48;
  
  if (((ulong)aValue & 0x1ffff00000000) == 0x1000000000000 ||
      ((ulong)aValue & 0xffff000000000000) != 0x1000000000000) {
    if (((ulong)aValue & 0xffff000000000000) != 0x1000000000000) goto LAB_00a8c425;
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar4) goto LAB_00a8c82b;
    *puVar7 = 0;
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  *puVar7 = 1;
  bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptConversion.cpp"
                              ,0x353,"(!TaggedInt::Is(aValue))","Should be detected");
  if (bVar4) {
    *puVar7 = 0;
LAB_00a8c425:
    bVar4 = VarIs<Js::RecyclableObject>(aValue);
    if (bVar4) {
      pRVar8 = UnsafeVarTo<Js::RecyclableObject>(aValue);
      local_48 = (((((pRVar8->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
                 scriptContext.ptr;
    }
    else {
      local_48 = (ScriptContext *)0x0;
    }
    bVar4 = true;
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    do {
      if (aValue != (Var)0x0) {
        if (((ulong)aValue & 0x1ffff00000000) != 0x1000000000000 &&
            ((ulong)aValue & 0xffff000000000000) == 0x1000000000000) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar7 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                      ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                      "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
          if (bVar4) {
            *puVar7 = 0;
            goto switchD_00a8c661_caseD_3;
          }
          break;
        }
        if (((ulong)aValue & 0xffff000000000000) == 0x1000000000000) goto switchD_00a8c661_caseD_3;
        if (aValue < (Var)0x4000000000000) goto LAB_00a8c507;
switchD_00a8c661_caseD_4:
        if (aValue < (Var)0x4000000000000) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar7 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.h"
                                      ,0xd4,"(Is(aValue))",
                                      "Ensure var is actually a \'JavascriptNumber\'");
          if (!bVar4) break;
          *puVar7 = 0;
        }
        return (double)((ulong)aValue ^ 0xfffc000000000000);
      }
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar7 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
      if (!bVar5) break;
      *puVar7 = 0;
LAB_00a8c507:
      pRVar8 = UnsafeVarTo<Js::RecyclableObject>(aValue);
      if (pRVar8 == (RecyclableObject *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar7 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
        if (!bVar5) break;
        *puVar7 = 0;
      }
      TVar1 = ((pRVar8->type).ptr)->typeId;
      if ((0x57 < (int)TVar1) && (BVar6 = RecyclableObject::IsExternal(pRVar8), BVar6 == 0)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar7 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                    "GetTypeId aValue has invalid TypeId");
        if (!bVar5) break;
        *puVar7 = 0;
      }
      switch(TVar1) {
      case TypeIds_Null:
        goto switchD_00a8c661_caseD_1;
      case TypeIds_Boolean:
        pJVar9 = UnsafeVarTo<Js::JavascriptBoolean>(aValue);
        if (pJVar9->value != 0) {
          return 1.0;
        }
switchD_00a8c661_caseD_1:
        return 0.0;
      case TypeIds_FirstNumberType:
switchD_00a8c661_caseD_3:
        return (double)(int)aValue;
      case TypeIds_Number:
        goto switchD_00a8c661_caseD_4;
      case TypeIds_Int64Number:
        pJVar10 = UnsafeVarTo<Js::JavascriptTypedNumber<long>>(aValue);
        return (double)pJVar10->m_value;
      case TypeIds_LastNumberType:
        pJVar11 = UnsafeVarTo<Js::JavascriptTypedNumber<unsigned_long>>(aValue);
        auVar13._0_8_ = (double)CONCAT44(0x43300000,(int)pJVar11->m_value);
        auVar13._8_4_ = (int)(pJVar11->m_value >> 0x20);
        auVar13._12_4_ = 0x45300000;
        return (auVar13._0_8_ - 4503599627370496.0) + (auVar13._8_8_ - 1.9342813113834067e+25);
      case TypeIds_String:
        this = UnsafeVarTo<Js::JavascriptString>(aValue);
        dVar12 = JavascriptString::ToDouble(this);
        return dVar12;
      case TypeIds_Symbol:
        JavascriptError::TryThrowTypeError(local_48,scriptContext,-0x7ff5ec77,(PCWSTR)0x0);
      case TypeIds_Undefined:
        pvVar2 = (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
                 super_JavascriptLibraryBase).nan.ptr;
        if (pvVar2 < (void *)0x4000000000000) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar7 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.h"
                                      ,0xd4,"(Is(aValue))",
                                      "Ensure var is actually a \'JavascriptNumber\'");
          if (!bVar4) goto LAB_00a8c82b;
          *puVar7 = 0;
        }
        return (double)((ulong)pvVar2 ^ 0xfffc000000000000);
      default:
        BVar6 = JavascriptOperators::IsObject(aValue);
        if (BVar6 != 0) goto LAB_00a8c627;
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar7 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptConversion.cpp"
                                    ,0x378,"(JavascriptOperators::IsObject(aValue))",
                                    "bad type object in conversion ToInteger");
        if (!bVar5) goto LAB_00a8c82b;
        *puVar7 = 0;
LAB_00a8c627:
        if (!bVar4) {
          JavascriptError::ThrowError(scriptContext,-0x7ff5fe4a,(PCWSTR)0x0);
        }
        aValue = ToPrimitive<(Js::JavascriptHint)2>(aValue,scriptContext);
        bVar4 = false;
      }
    } while( true );
  }
LAB_00a8c82b:
  pcVar3 = (code *)invalidInstructionException();
  (*pcVar3)();
}

Assistant:

double JavascriptConversion::ToNumber_Full(Var aValue,ScriptContext* scriptContext)
    {
        AssertMsg(!TaggedInt::Is(aValue), "Should be detected");
        ScriptContext * objectScriptContext = VarIs<RecyclableObject>(aValue) ? UnsafeVarTo<RecyclableObject>(aValue)->GetScriptContext() : nullptr;
        BOOL fPrimitiveOnly = false;
        while(true)
        {
            switch (JavascriptOperators::GetTypeId(aValue))
            {
            case TypeIds_Symbol:
                JavascriptError::TryThrowTypeError(objectScriptContext, scriptContext, JSERR_NeedNumber);
                // Fallthrough to return NaN if exceptions are disabled

            case TypeIds_Undefined:
                return JavascriptNumber::GetValue(scriptContext->GetLibrary()->GetNaN());

            case TypeIds_Null:
                return  0;

            case TypeIds_Integer:
                return TaggedInt::ToDouble(aValue);

            case TypeIds_Boolean:
                return UnsafeVarTo<JavascriptBoolean>(aValue)->GetValue() ? 1 : +0;

            case TypeIds_Number:
                return JavascriptNumber::GetValue(aValue);

            case TypeIds_Int64Number:
                return (double)UnsafeVarTo<JavascriptInt64Number>(aValue)->GetValue();

            case TypeIds_UInt64Number:
                return (double)UnsafeVarTo<JavascriptUInt64Number>(aValue)->GetValue();

            case TypeIds_String:
                return UnsafeVarTo<JavascriptString>(aValue)->ToDouble();

            default:
                {
                    AssertMsg(JavascriptOperators::IsObject(aValue), "bad type object in conversion ToInteger");
                    if(fPrimitiveOnly)
                    {
                        JavascriptError::ThrowError(scriptContext, VBSERR_OLENoPropOrMethod);
                    }
                    fPrimitiveOnly = true;
                    aValue = ToPrimitive<JavascriptHint::HintNumber>(aValue, scriptContext);
                }
            }
        }
    }